

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

Instruction * __thiscall spvtools::opt::Instruction::Clone(Instruction *this,IRContext *c)

{
  _func_int **pp_Var1;
  uint32_t uVar2;
  NonSemanticShaderDebugInfo100Instructions NVar3;
  PodType PVar4;
  Instruction *this_00;
  pointer this_01;
  pointer pIVar5;
  string message;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  Instruction *local_68;
  Instruction *local_60;
  pointer local_58;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_50
  ;
  spv_position_t local_48;
  
  this_00 = (Instruction *)operator_new(0x70);
  Instruction(this_00,c);
  this_00->opcode_ = this->opcode_;
  this_00->has_type_id_ = this->has_type_id_;
  this_00->has_result_id_ = this->has_result_id_;
  if (c->unique_id_ == 0xffffffff) {
LAB_00229703:
    __assert_fail("unique_id_ != std::numeric_limits<uint32_t>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.h"
                  ,0x1fe,"uint32_t spvtools::opt::IRContext::TakeNextUniqueId()");
  }
  uVar2 = c->unique_id_ + 1;
  c->unique_id_ = uVar2;
  this_00->unique_id_ = uVar2;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::operator=
            (&this_00->operands_,&this->operands_);
  local_60 = this;
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::operator=
            (&this_00->dbg_line_insts_,&this->dbg_line_insts_);
  this_01 = (this_00->dbg_line_insts_).
            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (this_00->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = this_00;
  if (this_01 != pIVar5) {
    local_50 = &c->consumer_;
    pp_Var1 = (_func_int **)(local_90 + 0x10);
    local_58 = pIVar5;
    do {
      if (c->unique_id_ == 0xffffffff) goto LAB_00229703;
      uVar2 = c->unique_id_ + 1;
      c->unique_id_ = uVar2;
      this_01->unique_id_ = uVar2;
      NVar3 = GetShader100DebugOpcode(this_01);
      if (NVar3 - NonSemanticShaderDebugInfo100DebugLine < 2) {
        PVar4.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((c->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar4.data._M_elems == (_Type)0x0) &&
           ((c->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
          local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
          local_90._0_8_ = pp_Var1;
          local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_48);
          local_90._16_8_ = local_48.line;
          *(undefined8 *)local_90._0_8_ = 0x667265766f204449;
          *(undefined8 *)(local_90._0_8_ + 8) = 0x797254202e776f6c;
          *(undefined8 *)(local_90._0_8_ + 0x10) = 0x676e696e6e757220;
          *(undefined8 *)(local_90._0_8_ + 0x18) = 0x746361706d6f6320;
          builtin_strncpy((char *)(local_90._0_8_ + 0x1d),"act-ids.",8);
          local_90._8_8_ = local_48.line;
          *(char *)(local_90._0_8_ + local_48.line) = '\0';
          local_48.line = 0;
          local_48.column = 0;
          local_48.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(local_50,SPV_MSG_ERROR,"",&local_48,(char *)local_90._0_8_);
          pIVar5 = local_58;
          if ((_func_int **)local_90._0_8_ != pp_Var1) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
            pIVar5 = local_58;
          }
        }
        if (this_01->has_result_id_ == false) {
          __assert_fail("has_result_id_",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        if (PVar4.data._M_elems == (_Type)0x0) {
          __assert_fail("res_id != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
        }
        local_90._0_8_ = &PTR__SmallVector_003e9b28;
        local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_90._16_4_ = PVar4.data._M_elems;
        local_90._8_4_ = (array<signed_char,_4UL>)0x1;
        local_90._12_4_ = (array<signed_char,_4UL>)0x0;
        local_90._24_8_ = pp_Var1;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((((this_01->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                          0xfffffffffffffffc) + (ulong)((uint)this_01->has_type_id_ * 0x30)),
                   (SmallVector<unsigned_int,_2UL> *)local_90);
        local_90._0_8_ = &PTR__SmallVector_003e9b28;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_70,local_70._M_head_impl);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != pIVar5);
  }
  local_68->dbg_scope_ = local_60->dbg_scope_;
  return local_68;
}

Assistant:

Instruction* Instruction::Clone(IRContext* c) const {
  Instruction* clone = new Instruction(c);
  clone->opcode_ = opcode_;
  clone->has_type_id_ = has_type_id_;
  clone->has_result_id_ = has_result_id_;
  clone->unique_id_ = c->TakeNextUniqueId();
  clone->operands_ = operands_;
  clone->dbg_line_insts_ = dbg_line_insts_;
  for (auto& i : clone->dbg_line_insts_) {
    i.unique_id_ = c->TakeNextUniqueId();
    if (i.IsDebugLineInst()) i.SetResultId(c->TakeNextId());
  }
  clone->dbg_scope_ = dbg_scope_;
  return clone;
}